

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inference.cpp
# Opt level: O2

void __thiscall Kernel::Inference::initMany(Inference *this,InferenceRule r,UnitList *premises)

{
  ulong uVar1;
  Unit *pUVar2;
  char cVar3;
  uint uVar4;
  ulong uVar5;
  byte bVar6;
  byte bVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  List<Kernel::Unit_*> *pLVar12;
  bool bVar13;
  bool bVar14;
  
  initDefault(this,AXIOM,r);
  *(ulong *)this = (*(ulong *)this & 0xfffffffffffffffc) + 1;
  this->_ptr1 = premises;
  this->_ptr2 = (void *)0x0;
  for (pLVar12 = premises; pLVar12 != (UnitList *)0x0; pLVar12 = pLVar12->_tail) {
    Unit::incRefCnt(pLVar12->_head);
  }
  computeTheoryRunningSums(this);
  uVar5 = *(ulong *)this;
  if (premises == (UnitList *)0x0) {
    cVar3 = (char)(uVar5 >> 8);
    bVar14 = ((uint)uVar5 & 0xff00) == 0xd400;
    bVar13 = (byte)(cVar3 + 0x2aU) < 8;
    *(ulong *)this =
         (ulong)bVar14 << 0x12 | uVar5 & 0xffffffffffe1ffff | (ulong)bVar13 << 0x13 |
         (ulong)(cVar3 == -0x21 || (byte)(cVar3 + 0x60U) < 0x3e) << 0x11 |
         (ulong)(bVar13 || bVar14) << 0x14;
  }
  else {
    uVar5 = uVar5 | 0x1e0000;
    *(ulong *)this = uVar5;
    for (; premises != (UnitList *)0x0; premises = premises->_tail) {
      pUVar2 = premises->_head;
      uVar4 = (uint)uVar5;
      bVar6 = (byte)((uVar5 & 0xffffffff) >> 2) & 7;
      bVar7 = *(byte *)&pUVar2->_inference >> 2 & 7;
      if (bVar7 < bVar6) {
        bVar7 = bVar6;
      }
      uVar1 = (uVar5 & 0xffffffffffffffe3) + (ulong)bVar7 * 4;
      *(ulong *)this = uVar1;
      uVar8 = (ulong)(*(uint *)&pUVar2->_inference & uVar4 & 0x20000);
      *(ulong *)this = uVar1 & 0xfffffffffffdffff | uVar8;
      uVar9 = (ulong)(*(uint *)&pUVar2->_inference & uVar4 & 0x40000);
      *(ulong *)this = uVar1 & 0xfffffffffff9ffff | uVar8 | uVar9;
      uVar10 = (ulong)(*(uint *)&pUVar2->_inference & uVar4 & 0x80000);
      *(ulong *)this = uVar1 & 0xfffffffffff1ffff | uVar8 | uVar9 | uVar10;
      uVar11 = (ulong)(*(uint *)&pUVar2->_inference & uVar4 & 0x100000);
      *(ulong *)this = uVar1 & 0xffffffffffe1ffff | uVar8 | uVar9 | uVar10 | uVar11;
      bVar6 = (byte)*(undefined4 *)&(pUVar2->_inference).field_0x4;
      bVar7 = (byte)(uVar5 >> 0x20);
      if (bVar6 < bVar7) {
        bVar7 = bVar6;
      }
      uVar5 = uVar1 & 0xffffff00ffe1ffff | uVar8 | uVar9 | uVar10 | uVar11 | (ulong)bVar7 << 0x20;
      *(ulong *)this = uVar5;
    }
  }
  updateStatistics(this);
  return;
}

Assistant:

void Inference::initMany(InferenceRule r, UnitList* premises)
{
  initDefault(UnitInputType::AXIOM /* the minimal element; we later compute maximum over premises*/,r);

  _kind = Kind::INFERENCE_MANY;
  _ptr1 = premises;
  _ptr2 = nullptr;

  UnitList* it= premises;
  while(it) {
    it->head()->incRefCnt();
    it=it->tail();
  }

  computeTheoryRunningSums();

  if (premises) {
    _isPureTheoryDescendant = true;
    _combAxiomsDescendant = true;
    _proxyAxiomsDescendant = true;
    _holAxiomsDescendant = true;
    it=premises;
    while(it) {
      const Inference& inf = it->head()->inference();
      _inputType = getInputType(_inputType,inf.inputType());
      _isPureTheoryDescendant &= inf.isPureTheoryDescendant();
      _combAxiomsDescendant &= inf.isCombAxiomsDescendant();
      _proxyAxiomsDescendant &= inf.isProxyAxiomsDescendant();
      _holAxiomsDescendant &= inf.isHolAxiomsDescendant();
      _sineLevel = min(_sineLevel,inf.getSineLevel());
      it=it->tail();
    }
  } else {
    _isPureTheoryDescendant = isTheoryAxiom();
    _combAxiomsDescendant = isCombinatorAxiom();
    _proxyAxiomsDescendant = isProxyAxiom();
    _holAxiomsDescendant = _combAxiomsDescendant || _proxyAxiomsDescendant;
  }

  updateStatistics();
}